

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDU_Factory.cpp
# Opt level: O0

void __thiscall KDIS::UTILS::PDU_Factory::RemoveFilter(PDU_Factory *this,PDU_Factory_Filter *F)

{
  bool bVar1;
  reference ppPVar2;
  const_iterator local_38;
  PDU_Factory_Filter **local_30;
  __normal_iterator<KDIS::UTILS::PDU_Factory_Filter_**,_std::vector<KDIS::UTILS::PDU_Factory_Filter_*,_std::allocator<KDIS::UTILS::PDU_Factory_Filter_*>_>_>
  local_28;
  iterator itrEnd;
  iterator itr;
  PDU_Factory_Filter *F_local;
  PDU_Factory *this_local;
  
  itrEnd = std::
           vector<KDIS::UTILS::PDU_Factory_Filter_*,_std::allocator<KDIS::UTILS::PDU_Factory_Filter_*>_>
           ::begin(&this->m_vFilters);
  local_28._M_current =
       (PDU_Factory_Filter **)
       std::
       vector<KDIS::UTILS::PDU_Factory_Filter_*,_std::allocator<KDIS::UTILS::PDU_Factory_Filter_*>_>
       ::end(&this->m_vFilters);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&itrEnd,&local_28);
    if (!bVar1) break;
    ppPVar2 = __gnu_cxx::
              __normal_iterator<KDIS::UTILS::PDU_Factory_Filter_**,_std::vector<KDIS::UTILS::PDU_Factory_Filter_*,_std::allocator<KDIS::UTILS::PDU_Factory_Filter_*>_>_>
              ::operator*(&itrEnd);
    if (*ppPVar2 == F) {
      __gnu_cxx::
      __normal_iterator<KDIS::UTILS::PDU_Factory_Filter*const*,std::vector<KDIS::UTILS::PDU_Factory_Filter*,std::allocator<KDIS::UTILS::PDU_Factory_Filter*>>>
      ::__normal_iterator<KDIS::UTILS::PDU_Factory_Filter**>
                ((__normal_iterator<KDIS::UTILS::PDU_Factory_Filter*const*,std::vector<KDIS::UTILS::PDU_Factory_Filter*,std::allocator<KDIS::UTILS::PDU_Factory_Filter*>>>
                  *)&local_38,&itrEnd);
      local_30 = (PDU_Factory_Filter **)
                 std::
                 vector<KDIS::UTILS::PDU_Factory_Filter_*,_std::allocator<KDIS::UTILS::PDU_Factory_Filter_*>_>
                 ::erase(&this->m_vFilters,local_38);
      itrEnd = (iterator)local_30;
    }
    __gnu_cxx::
    __normal_iterator<KDIS::UTILS::PDU_Factory_Filter_**,_std::vector<KDIS::UTILS::PDU_Factory_Filter_*,_std::allocator<KDIS::UTILS::PDU_Factory_Filter_*>_>_>
    ::operator++(&itrEnd);
  }
  return;
}

Assistant:

void PDU_Factory::RemoveFilter( PDU_Factory_Filter * F )
{
    // Check for filter and remove it if we find it.
    vector<PDU_Factory_Filter*>::iterator itr = m_vFilters.begin();
    vector<PDU_Factory_Filter*>::iterator itrEnd = m_vFilters.end();
    for( ; itr != itrEnd; ++itr )
    {
        if( (*itr) == F )
        {
            itr = m_vFilters.erase( itr );
        }
    }
}